

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uStack_1ac;
  long local_1a8;
  size_t i_5;
  undefined4 uStack_194;
  long local_190;
  size_t i_4;
  undefined4 uStack_17c;
  long local_178;
  size_t i_3;
  undefined4 uStack_164;
  long local_160;
  size_t i_2;
  undefined4 uStack_14c;
  long local_148;
  size_t i_1;
  undefined4 uStack_134;
  long local_130;
  size_t i;
  ptls_context_t ctxbuf;
  undefined1 local_50 [8];
  ptls_minicrypto_secp256r1sha256_sign_certificate_t sign_certificate;
  ptls_iovec_t cert;
  char **argv_local;
  int argc_local;
  
  subtest("secp256r1",test_secp256r1_key_exchange);
  subtest("x25519",test_x25519_key_exchange);
  subtest("secp256r1-sign",test_secp256r1_sign);
  join_0x00000010_0x00000000_ = ptls_iovec_init(anon_var_dwarf_10960,0x264);
  join_0x00000010_0x00000000_ = ptls_iovec_init(anon_var_dwarf_10977,0x20);
  ptls_minicrypto_init_secp256r1sha256_sign_certificate
            ((ptls_minicrypto_secp256r1sha256_sign_certificate_t *)local_50,
             join_0x00000010_0x00000000_);
  i = (size_t)ptls_minicrypto_random_bytes;
  ctxbuf.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
  ctxbuf.get_time = (ptls_get_time_t *)ptls_minicrypto_key_exchanges;
  ctxbuf.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_minicrypto_cipher_suites;
  ctxbuf.cipher_suites = (ptls_cipher_suite_t **)(sign_certificate.key + 0x18);
  ctxbuf.certificates.list = (ptls_iovec_t *)0x1;
  ctxbuf.certificates.count = 0;
  ctxbuf.esni = (ptls_esni_context_t **)0x0;
  ctxbuf.on_client_hello = (ptls_on_client_hello_t *)0x0;
  ctxbuf.emit_certificate = (ptls_emit_certificate_t *)local_50;
  ctxbuf.sign_certificate = (ptls_sign_certificate_t *)0x0;
  ctxbuf.verify_certificate._0_4_ = 0;
  ctxbuf.verify_certificate._4_4_ = 0;
  ctxbuf.ticket_lifetime = 0;
  ctxbuf.max_early_data_size = 0;
  ctxbuf.hkdf_label_prefix__obsolete._0_1_ = (byte)ctxbuf.hkdf_label_prefix__obsolete & 0xe0;
  ctxbuf._104_8_ = 0;
  ctxbuf.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ctxbuf.save_ticket = (ptls_save_ticket_t *)0x0;
  ctxbuf.log_event = (ptls_log_event_t *)0x0;
  ctxbuf.update_open_count = (ptls_update_open_count_t *)0x0;
  ctxbuf.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctxbuf.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
  memset(&ctxbuf.update_esni_key,0,0x10);
  ctxbuf.pkey_buf.len = 0;
  ctxbuf.on_extension = (ptls_on_extension_t *)0x0;
  ctx_peer = (ptls_context_t *)&i;
  ctx = (ptls_context_t *)&i;
  for (local_130 = 0; ffx_variants[local_130].algo != (ptls_cipher_algorithm_t *)0x0;
      local_130 = local_130 + 1) {
  }
  ffx_variants[local_130].algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b125_r8;
  *(ulong *)&ffx_variants[local_130].bit_length = CONCAT44(uStack_134,0x7d);
  for (local_148 = 0; ffx_variants[local_148].algo != (ptls_cipher_algorithm_t *)0x0;
      local_148 = local_148 + 1) {
  }
  ffx_variants[local_148].algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b31_r6;
  *(ulong *)&ffx_variants[local_148].bit_length = CONCAT44(uStack_14c,0x1f);
  for (local_160 = 0; ffx_variants[local_160].algo != (ptls_cipher_algorithm_t *)0x0;
      local_160 = local_160 + 1) {
  }
  ffx_variants[local_160].algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b53_r4;
  *(ulong *)&ffx_variants[local_160].bit_length = CONCAT44(uStack_164,0x35);
  for (local_178 = 0; ffx_variants[local_178].algo != (ptls_cipher_algorithm_t *)0x0;
      local_178 = local_178 + 1) {
  }
  ffx_variants[local_178].algo = &ptls_ffx_ptls_minicrypto_chacha20_b256_r8;
  *(ulong *)&ffx_variants[local_178].bit_length = CONCAT44(uStack_17c,0x100);
  for (local_190 = 0; ffx_variants[local_190].algo != (ptls_cipher_algorithm_t *)0x0;
      local_190 = local_190 + 1) {
  }
  ffx_variants[local_190].algo = &ptls_ffx_ptls_minicrypto_chacha20_b32_r6;
  *(ulong *)&ffx_variants[local_190].bit_length = CONCAT44(uStack_194,0x20);
  for (local_1a8 = 0; ffx_variants[local_1a8].algo != (ptls_cipher_algorithm_t *)0x0;
      local_1a8 = local_1a8 + 1) {
  }
  ffx_variants[local_1a8].algo = &ptls_ffx_ptls_minicrypto_chacha20_b57_r4;
  *(ulong *)&ffx_variants[local_1a8].bit_length = CONCAT44(uStack_1ac,0x39);
  subtest("picotls",test_picotls);
  subtest("hrr",test_hrr);
  iVar1 = done_testing();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    subtest("secp256r1", test_secp256r1_key_exchange);
    subtest("x25519", test_x25519_key_exchange);
    subtest("secp256r1-sign", test_secp256r1_sign);

    ptls_iovec_t cert = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t sign_certificate;
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(&sign_certificate,
                                                          ptls_iovec_init(SECP256R1_PRIVATE_KEY, SECP256R1_PRIVATE_KEY_SIZE));

    ptls_context_t ctxbuf = {ptls_minicrypto_random_bytes,
                             &ptls_get_time,
                             ptls_minicrypto_key_exchanges,
                             ptls_minicrypto_cipher_suites,
                             {&cert, 1},
                             NULL,
                             NULL,
                             NULL,
                             &sign_certificate.super};
    ctx = ctx_peer = &ctxbuf;
    ADD_FFX_AES128_ALGORITHMS(minicrypto);
    ADD_FFX_CHACHA20_ALGORITHMS(minicrypto);

    subtest("picotls", test_picotls);
    subtest("hrr", test_hrr);

    return done_testing();
    return done_testing();
}